

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLiSample> * __thiscall
pbrt::UniformInfiniteLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,UniformInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  Float a;
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar11 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [16];
  Vector3f VVar17;
  Point3f PVar18;
  SampledSpectrum SVar19;
  Tuple2<pbrt::Point2,_float> local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  SampledSpectrum local_30;
  undefined1 auVar15 [56];
  
  auVar15 = in_ZMM1._8_56_;
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_60 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar6._0_16_);
  if (mode == WithMIS) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    VVar17 = SampleUniformSphere((Point2f *)&local_60);
    auVar7._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = in_register_00001208;
    local_48 = auVar7._0_16_;
    a = this->scale;
    auVar11 = (undefined1  [56])0x0;
    SVar19 = DenselySampledSpectrum::Sample(&this->Lemit,&lambda);
    auVar13._0_8_ = SVar19.values.values._8_8_;
    auVar13._8_56_ = auVar15;
    auVar8._0_8_ = SVar19.values.values._0_8_;
    auVar8._8_56_ = auVar11;
    local_30.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar13._0_16_);
    auVar11 = (undefined1  [56])0x0;
    SVar19 = SampledSpectrum::operator*(&local_30,a);
    auVar14._0_8_ = SVar19.values.values._8_8_;
    auVar14._8_56_ = auVar15;
    auVar9._0_8_ = SVar19.values.values._0_8_;
    auVar9._8_56_ = auVar11;
    local_58 = auVar14._0_16_;
    PVar18 = LightSampleContext::p(&ctx);
    auVar10._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar11;
    fVar1 = this->sceneRadius;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    fVar1 = fVar1 + fVar1;
    auVar5 = vmovshdup_avx(local_48);
    fVar3 = PVar18.super_Tuple3<pbrt::Point3,_float>.x + local_48._0_4_ * fVar1;
    auVar16 = vmovshdup_avx(auVar10._0_16_);
    fVar4 = PVar18.super_Tuple3<pbrt::Point3,_float>.z +
            VVar17.super_Tuple3<pbrt::Vector3,_float>.z * fVar1;
    fVar1 = auVar16._0_4_ + auVar5._0_4_ * fVar1;
    auVar16._4_4_ = fVar3;
    auVar16._0_4_ = fVar3;
    auVar16._8_4_ = fVar3;
    auVar16._12_4_ = fVar3;
    auVar12._4_4_ = fVar4;
    auVar12._0_4_ = fVar4;
    auVar12._8_4_ = fVar4;
    auVar12._12_4_ = fVar4;
    auVar5._4_4_ = fVar1;
    auVar5._0_4_ = fVar1;
    auVar5._8_4_ = fVar1;
    auVar5._12_4_ = fVar1;
    auVar5 = vmovlhps_avx(auVar16,auVar5);
    *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) = ZEXT432(0) << 0x20
    ;
    auVar16 = vunpcklpd_avx(auVar9._0_16_,local_58);
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar16;
    uVar2 = vmovlps_avx(local_48);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
         VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3da2f983;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar5;
    uVar2 = vmovlps_avx(auVar12);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         &(this->super_LightBase).mediumInterface;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  }
  __return_storage_ptr__->set = mode != WithMIS;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> UniformInfiniteLight::SampleLi(
    LightSampleContext ctx, Point2f u, SampledWavelengths lambda,
    LightSamplingMode mode) const {
    if (mode == LightSamplingMode::WithMIS)
        return {};
    // Return uniform spherical sample for uniform infinite light
    Vector3f wi = SampleUniformSphere(u);
    Float pdf = UniformSpherePDF();
    return LightLiSample(scale * Lemit.Sample(lambda), wi, pdf,
                         Interaction(ctx.p() + wi * (2 * sceneRadius), &mediumInterface));
}